

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tcd.c
# Opt level: O1

opj_bool tcd_dc_level_shift_decode(opj_tcd_v2_t *p_tcd)

{
  int iVar1;
  int iVar2;
  int iVar3;
  opj_tcd_tile_v2_t *poVar4;
  opj_tcd_resolution_v2_t *poVar5;
  float fVar6;
  byte bVar7;
  float fVar8;
  uint uVar9;
  opj_image_comp_t *poVar10;
  int iVar11;
  opj_tccp_t *poVar12;
  opj_tcd_tilecomp_v2_t *poVar13;
  int iVar14;
  float fVar15;
  float fVar16;
  int iVar17;
  int iVar18;
  float *pfVar19;
  uint uVar20;
  
  poVar4 = p_tcd->tcd_image->tiles;
  if (poVar4->numcomps != 0) {
    poVar10 = p_tcd->image->comps;
    poVar12 = p_tcd->tcp->tccps;
    poVar13 = poVar4->comps;
    uVar9 = 0;
    do {
      bVar7 = (byte)poVar10->prec;
      if (poVar10->sgnd == 0) {
        fVar15 = (float)~(-1 << (bVar7 & 0x1f));
        fVar8 = 0.0;
      }
      else {
        iVar14 = 1 << (bVar7 - 1 & 0x1f);
        fVar8 = (float)-iVar14;
        fVar15 = (float)(iVar14 + -1);
      }
      poVar5 = poVar13->resolutions;
      uVar20 = poVar10->resno_decoded;
      iVar14 = poVar5[uVar20].x1;
      iVar1 = poVar5[uVar20].x0;
      iVar2 = poVar5[uVar20].y0;
      iVar11 = iVar14 - iVar1;
      iVar3 = poVar5[uVar20].y1;
      uVar20 = poVar13->x1 - (poVar13->x0 + iVar11);
      pfVar19 = (float *)poVar13->data;
      if (poVar12->qmfbid == 1) {
        if (iVar3 != iVar2) {
          iVar17 = 0;
          do {
            iVar18 = iVar11;
            if (iVar14 != iVar1) {
              do {
                fVar6 = (float)(poVar12->m_dc_level_shift + (int)*pfVar19);
                fVar16 = fVar15;
                if ((int)fVar6 < (int)fVar15) {
                  fVar16 = fVar6;
                }
                if ((int)fVar6 < (int)fVar8) {
                  fVar16 = fVar8;
                }
                *pfVar19 = fVar16;
                pfVar19 = pfVar19 + 1;
                iVar18 = iVar18 + -1;
              } while (iVar18 != 0);
            }
            pfVar19 = pfVar19 + uVar20;
            iVar17 = iVar17 + 1;
          } while (iVar17 != iVar3 - iVar2);
        }
      }
      else if (iVar3 != iVar2) {
        iVar17 = 0;
        do {
          iVar18 = iVar11;
          if (iVar14 != iVar1) {
            do {
              fVar6 = (float)((int)(long)ROUND(*pfVar19) + poVar12->m_dc_level_shift);
              fVar16 = fVar6;
              if ((int)fVar15 <= (int)fVar6) {
                fVar16 = fVar15;
              }
              if ((int)fVar6 < (int)fVar8) {
                fVar16 = fVar8;
              }
              *pfVar19 = fVar16;
              pfVar19 = pfVar19 + 1;
              iVar18 = iVar18 + -1;
            } while (iVar18 != 0);
          }
          pfVar19 = pfVar19 + uVar20;
          iVar17 = iVar17 + 1;
        } while (iVar17 != iVar3 - iVar2);
      }
      poVar10 = poVar10 + 1;
      poVar12 = poVar12 + 1;
      poVar13 = poVar13 + 1;
      uVar9 = uVar9 + 1;
    } while (uVar9 < poVar4->numcomps);
  }
  return 1;
}

Assistant:

opj_bool tcd_dc_level_shift_decode ( opj_tcd_v2_t *p_tcd )
{
	OPJ_UINT32 compno;
	opj_tcd_tilecomp_v2_t * l_tile_comp = 00;
	opj_tccp_t * l_tccp = 00;
	opj_image_comp_t * l_img_comp = 00;
	opj_tcd_resolution_v2_t* l_res = 00;
	opj_tcp_v2_t * l_tcp = 00;
	opj_tcd_tile_v2_t * l_tile;
	OPJ_UINT32 l_width,l_height,i,j;
	OPJ_INT32 * l_current_ptr;
	OPJ_INT32 l_min, l_max;
	OPJ_UINT32 l_stride;

	l_tile = p_tcd->tcd_image->tiles;
	l_tile_comp = l_tile->comps;
	l_tcp = p_tcd->tcp;
	l_tccp = p_tcd->tcp->tccps;
	l_img_comp = p_tcd->image->comps;

	for (compno = 0; compno < l_tile->numcomps; compno++) {
		l_res = l_tile_comp->resolutions + l_img_comp->resno_decoded;
		l_width = (l_res->x1 - l_res->x0);
		l_height = (l_res->y1 - l_res->y0);
		l_stride = (l_tile_comp->x1 - l_tile_comp->x0) - l_width;

		if (l_img_comp->sgnd) {
			l_min = -(1 << (l_img_comp->prec - 1));
			l_max = (1 << (l_img_comp->prec - 1)) - 1;
		}
		else {
            l_min = 0;
			l_max = (1 << l_img_comp->prec) - 1;
		}

		l_current_ptr = l_tile_comp->data;

		if (l_tccp->qmfbid == 1) {
			for (j=0;j<l_height;++j) {
				for (i = 0; i < l_width; ++i) {
					*l_current_ptr = int_clamp(*l_current_ptr + l_tccp->m_dc_level_shift, l_min, l_max);
					++l_current_ptr;
				}
				l_current_ptr += l_stride;
			}
		}
		else {
			for (j=0;j<l_height;++j) {
				for (i = 0; i < l_width; ++i) {
					OPJ_FLOAT32 l_value = *((OPJ_FLOAT32 *) l_current_ptr);
					*l_current_ptr = int_clamp(lrintf(l_value) + l_tccp->m_dc_level_shift, l_min, l_max); ;
					++l_current_ptr;
				}
				l_current_ptr += l_stride;
			}
		}

		++l_img_comp;
		++l_tccp;
		++l_tile_comp;
	}

	return OPJ_TRUE;
}